

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypt.c
# Opt level: O0

int crypt_init(LIBSSH2_SESSION *session,LIBSSH2_CRYPT_METHOD *method,uchar *iv,int *free_iv,
              uchar *secret,int *free_secret,int encrypt,void **abstract)

{
  int iVar1;
  int *piVar2;
  crypt_ctx *ctx;
  int *free_secret_local;
  uchar *secret_local;
  int *free_iv_local;
  uchar *iv_local;
  LIBSSH2_CRYPT_METHOD *method_local;
  LIBSSH2_SESSION *session_local;
  
  piVar2 = (int *)(*session->alloc)(0x18,&session->abstract);
  if (piVar2 == (int *)0x0) {
    session_local._4_4_ = -6;
  }
  else {
    *piVar2 = encrypt;
    *(_func_EVP_CIPHER_ptr **)(piVar2 + 2) = method->algo;
    iVar1 = _libssh2_cipher_init
                      ((EVP_CIPHER_CTX **)(piVar2 + 4),*(_func_EVP_CIPHER_ptr **)(piVar2 + 2),iv,
                       secret,encrypt);
    if (iVar1 == 0) {
      *abstract = piVar2;
      *free_iv = 1;
      *free_secret = 1;
      session_local._4_4_ = 0;
    }
    else {
      (*session->free)(piVar2,&session->abstract);
      session_local._4_4_ = -1;
    }
  }
  return session_local._4_4_;
}

Assistant:

static int
crypt_init(LIBSSH2_SESSION * session,
           const LIBSSH2_CRYPT_METHOD * method,
           unsigned char *iv, int *free_iv,
           unsigned char *secret, int *free_secret,
           int encrypt, void **abstract)
{
    struct crypt_ctx *ctx = LIBSSH2_ALLOC(session,
                                          sizeof(struct crypt_ctx));
    if (!ctx)
        return LIBSSH2_ERROR_ALLOC;

    ctx->encrypt = encrypt;
    ctx->algo = method->algo;
    if (_libssh2_cipher_init(&ctx->h, ctx->algo, iv, secret, encrypt)) {
        LIBSSH2_FREE(session, ctx);
        return -1;
    }
    *abstract = ctx;
    *free_iv = 1;
    *free_secret = 1;
    return 0;
}